

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

pszind_t psset_hpdata_heap_index(hpdata_t *ps)

{
  long lVar1;
  pszind_t pVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  sVar3 = duckdb_je_sz_psz_quantize_floor(ps->h_longest_free_range << 0xc);
  if (sVar3 < 0x7000000000000001) {
    uVar6 = sVar3 - 1;
    if (uVar6 == 0) {
      uVar5 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar5 = (uint)lVar1 ^ 0x3f;
    }
    iVar7 = 0x32 - uVar5;
    if (0x32 < uVar5) {
      iVar7 = 0;
    }
    bVar4 = 0xc;
    if (0x4000 < sVar3) {
      bVar4 = (char)iVar7 + 0xb;
    }
    pVar2 = ((uint)(uVar6 >> (bVar4 & 0x3f)) & 3) + iVar7 * 4;
  }
  else {
    pVar2 = 199;
  }
  return pVar2;
}

Assistant:

static pszind_t
psset_hpdata_heap_index(const hpdata_t *ps) {
	assert(!hpdata_full(ps));
	assert(!hpdata_empty(ps));
	size_t longest_free_range = hpdata_longest_free_range_get(ps);
	pszind_t pind = sz_psz2ind(sz_psz_quantize_floor(
	    longest_free_range << LG_PAGE));
	assert(pind < PSSET_NPSIZES);
	return pind;
}